

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

bool __thiscall
cmLocalUnixMakefileGenerator3::UpdateDependencies
          (cmLocalUnixMakefileGenerator3 *this,string *tgtInfo,bool verbose,bool color)

{
  cmMakefile *pcVar1;
  size_type sVar2;
  cmFileTimeCache *this_00;
  pointer pcVar3;
  pointer pcVar4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  Encoding EVar10;
  string *psVar11;
  path *this_01;
  char *extraout_RDX;
  bool bVar12;
  bool bVar13;
  string_view value;
  int result_1;
  undefined4 uStack_ea4;
  cmDependsCompiler depsManager;
  string internalDependFile;
  string depends;
  string targetDir;
  cmList depFiles;
  string depFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd0;
  string targetName_1;
  DependencyMap validDependencies;
  string dirInfoFile;
  byte abStack_b08 [2776];
  
  bVar6 = cmMakefile::ReadListFile
                    ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,tgtInfo);
  if ((!bVar6) || (bVar6 = cmSystemTools::GetErrorOccurredFlag(), bVar6)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dirInfoFile,"Target DependInfo.cmake file not found",
               (allocator<char> *)&validDependencies);
    cmSystemTools::Error(&dirInfoFile);
    std::__cxx11::string::~string((string *)&dirInfoFile);
  }
  CheckMultipleOutputs(this,verbose);
  cmsys::SystemTools::GetFilenamePath(&targetDir,tgtInfo);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dirInfoFile,"CMAKE_DEPENDS_LANGUAGES",(allocator<char> *)&validDependencies)
  ;
  psVar11 = cmMakefile::GetSafeDefinition(pcVar1,&dirInfoFile);
  sVar2 = psVar11->_M_string_length;
  std::__cxx11::string::~string((string *)&dirInfoFile);
  if (sVar2 == 0) {
    bVar6 = true;
  }
  else {
    std::operator+(&internalDependFile,&targetDir,"/depend.internal");
    std::operator+(&depends,&targetDir,"/depend.make");
    this_00 = (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
               CMakeInstance->FileTimeCache)._M_t.
              super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>._M_t.
              super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>.
              super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl;
    bVar7 = cmFileTimeCache::Compare(this_00,&internalDependFile,tgtInfo,(int *)&validDependencies);
    bVar12 = (int)validDependencies._M_t._M_impl._0_4_ < 0;
    if (verbose && (!bVar7 || bVar12)) {
      cmStrCat<char_const(&)[11],std::__cxx11::string_const&,char_const(&)[27],std::__cxx11::string_const&,char_const(&)[4]>
                (&dirInfoFile,(char (*) [11])"Dependee \"",tgtInfo,
                 (char (*) [27])"\" is newer than depender \"",&internalDependFile,
                 (char (*) [4])0x68926a);
      cmSystemTools::Stdout(&dirInfoFile);
      std::__cxx11::string::~string((string *)&dirInfoFile);
    }
    psVar11 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[44]>
              (&dirInfoFile,psVar11,(char (*) [44])"/CMakeFiles/CMakeDirectoryInformation.cmake");
    bVar8 = cmFileTimeCache::Compare(this_00,&internalDependFile,&dirInfoFile,&result_1);
    bVar13 = result_1 < 0;
    if (!bVar8 || bVar13) {
      if (verbose) {
        cmStrCat<char_const(&)[11],std::__cxx11::string&,char_const(&)[27],std::__cxx11::string_const&,char_const(&)[4]>
                  ((string *)&validDependencies,(char (*) [11])"Dependee \"",&dirInfoFile,
                   (char (*) [27])"\" is newer than depender \"",&internalDependFile,
                   (char (*) [4])0x68926a);
        cmSystemTools::Stdout((string *)&validDependencies);
        std::__cxx11::string::~string((string *)&validDependencies);
      }
      std::__cxx11::string::~string((string *)&dirInfoFile);
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &validDependencies._M_t._M_impl.super__Rb_tree_header._M_header;
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_003f0361:
      if (verbose) {
        cmsys::SystemTools::GetFilenameName(&dirInfoFile,&targetDir);
        std::__cxx11::string::substr((ulong)&result_1,(ulong)&dirInfoFile);
        std::__cxx11::string::operator=((string *)&dirInfoFile,(string *)&result_1);
        std::__cxx11::string::~string((string *)&result_1);
        cmStrCat<char_const(&)[33],std::__cxx11::string&>
                  ((string *)&result_1,(char (*) [33])"Scanning dependencies of target ",
                   &dirInfoFile);
        cmSystemTools::MakefileColorEcho(0x106,(char *)CONCAT44(uStack_ea4,result_1),true,color);
        std::__cxx11::string::~string((string *)&result_1);
        std::__cxx11::string::~string((string *)&dirInfoFile);
      }
      bVar6 = ScanDependencies(this,&targetDir,&depends,&internalDependFile,&validDependencies);
    }
    else {
      std::__cxx11::string::~string((string *)&dirInfoFile);
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &validDependencies._M_t._M_impl.super__Rb_tree_header._M_header;
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      cmDependsC::cmDependsC((cmDependsC *)&dirInfoFile);
      dirInfoFile.field_2._M_allocated_capacity =
           CONCAT71(dirInfoFile.field_2._M_allocated_capacity._1_7_,verbose);
      dirInfoFile.field_2._8_8_ = this_00;
      bVar9 = cmDepends::Check((cmDepends *)&dirInfoFile,&depends,&internalDependFile,
                               &validDependencies);
      cmDependsC::~cmDependsC((cmDependsC *)&dirInfoFile);
      bVar6 = true;
      if ((!bVar7 || bVar12) || ((!bVar8 || bVar13) || !bVar9)) goto LAB_003f0361;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&validDependencies._M_t);
    std::__cxx11::string::~string((string *)&depends);
    std::__cxx11::string::~string((string *)&internalDependFile);
  }
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dirInfoFile,"CMAKE_DEPENDS_DEPENDENCY_FILES",
             (allocator<char> *)&validDependencies);
  psVar11 = cmMakefile::GetSafeDefinition(pcVar1,&dirInfoFile);
  std::__cxx11::string::string((string *)&depends,(string *)psVar11);
  std::__cxx11::string::~string((string *)&dirInfoFile);
  if (depends._M_string_length == 0) goto LAB_003f080d;
  cmList::cmList(&depFiles,&depends,Yes);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result_1,
                 &targetDir,"/compiler_depend.internal");
  std::operator+(&depFile,&targetDir,"/compiler_depend.make");
  internalDependFile.field_2._8_8_ = &internalDependFile._M_string_length;
  internalDependFile._M_string_length._0_4_ = 0;
  internalDependFile.field_2._M_allocated_capacity = 0;
  depsManager.Verbose = false;
  depsManager.LocalGenerator = (cmLocalUnixMakefileGenerator3 *)0x0;
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dirInfoFile,"CMAKE_DEPENDS_IN_PROJECT_ONLY",
             (allocator<char> *)&validDependencies);
  psVar11 = cmMakefile::GetSafeDefinition(pcVar1,&dirInfoFile);
  value._M_str = extraout_RDX;
  value._M_len = (size_t)(psVar11->_M_dataplus)._M_p;
  bVar7 = cmValue::IsOn((cmValue *)psVar11->_M_string_length,value);
  std::__cxx11::string::~string((string *)&dirInfoFile);
  depsManager.Verbose = verbose;
  depsManager.LocalGenerator = this;
  if (bVar7) {
    psVar11 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)this);
    pcVar3 = (psVar11->_M_dataplus)._M_p;
    sVar2 = psVar11->_M_string_length;
    psVar11 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    pcVar4 = (psVar11->_M_dataplus)._M_p;
    sVar5 = psVar11->_M_string_length;
    dirInfoFile.field_2._M_allocated_capacity = 0;
    dirInfoFile.field_2._8_8_ = 0;
    dirInfoFile._M_dataplus._M_p = (pointer)0x0;
    dirInfoFile._M_string_length = 0;
    dirInfoFile._M_dataplus._M_p = (pointer)operator_new(0x20);
    *(size_type *)dirInfoFile._M_dataplus._M_p = sVar2;
    *(pointer *)((long)dirInfoFile._M_dataplus._M_p + 8) = pcVar3;
    *(size_type *)((long)dirInfoFile._M_dataplus._M_p + 0x10) = sVar5;
    *(pointer *)((long)dirInfoFile._M_dataplus._M_p + 0x18) = pcVar4;
    dirInfoFile.field_2._8_8_ =
         std::
         _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(anonymous_namespace)::NotInProjectDir>
         ::_M_invoke;
    dirInfoFile.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(anonymous_namespace)::NotInProjectDir>
         ::_M_manager;
  }
  else {
    dirInfoFile.field_2._M_allocated_capacity = 0;
    dirInfoFile.field_2._8_8_ = 0;
    dirInfoFile._M_dataplus._M_p = (pointer)0x0;
    dirInfoFile._M_string_length = 0;
  }
  bVar7 = cmDependsCompiler::CheckDependencies
                    (&depsManager,(string *)&result_1,&depFiles.Values,
                     (DependencyMap *)&internalDependFile,
                     (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&dirInfoFile);
  std::_Function_base::~_Function_base((_Function_base *)&dirInfoFile);
  if (bVar7) {
LAB_003f062c:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)&internalDependFile);
    std::__cxx11::string::~string((string *)&depFile);
    std::__cxx11::string::~string((string *)&result_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depFiles.Values);
  }
  else {
    if (verbose) {
      std::__cxx11::string::string((string *)&local_dd0,(string *)&targetDir);
      cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                ((cmCMakePath *)&validDependencies,&local_dd0,generic_format);
      cmCMakePath::GetFileName((cmCMakePath *)&dirInfoFile,(cmCMakePath *)&validDependencies);
      this_01 = &cmCMakePath::RemoveExtension((cmCMakePath *)&dirInfoFile)->Path;
      std::filesystem::__cxx11::path::generic_string(&targetName_1,this_01);
      std::filesystem::__cxx11::path::~path((path *)&dirInfoFile);
      std::filesystem::__cxx11::path::~path((path *)&validDependencies);
      std::__cxx11::string::~string((string *)&local_dd0);
      cmStrCat<char_const(&)[55],std::__cxx11::string&>
                (&dirInfoFile,
                 (char (*) [55])"Consolidate compiler generated dependencies of target ",
                 &targetName_1);
      cmSystemTools::MakefileColorEcho(0x106,dirInfoFile._M_dataplus._M_p,true,color);
      std::__cxx11::string::~string((string *)&dirInfoFile);
      std::__cxx11::string::~string((string *)&targetName_1);
    }
    EVar10 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
               _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&dirInfoFile,&depFile,false,EVar10);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)&dirInfoFile,true);
    if ((abStack_b08[*(long *)(dirInfoFile._M_dataplus._M_p + -0x18)] & 5) == 0) {
      EVar10 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                 _vptr_cmGlobalGenerator[5])();
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)&validDependencies,(string *)&result_1,false,EVar10);
      if ((*(byte *)((long)&validDependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                    + *(long *)(CONCAT44(validDependencies._M_t._M_impl._4_4_,
                                         validDependencies._M_t._M_impl._0_4_) + -0x18)) & 5) == 0)
      {
        WriteDisclaimer(this,(ostream *)&dirInfoFile);
        WriteDisclaimer(this,(ostream *)&validDependencies);
        cmDependsCompiler::WriteDependencies
                  (&depsManager,(DependencyMap *)&internalDependFile,(ostream *)&dirInfoFile,
                   (ostream *)&validDependencies);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&validDependencies);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&dirInfoFile);
        goto LAB_003f062c;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&validDependencies);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&dirInfoFile);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)&internalDependFile);
    std::__cxx11::string::~string((string *)&depFile);
    std::__cxx11::string::~string((string *)&result_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depFiles.Values);
    bVar6 = false;
  }
LAB_003f080d:
  std::__cxx11::string::~string((string *)&depends);
  std::__cxx11::string::~string((string *)&targetDir);
  return bVar6;
}

Assistant:

bool cmLocalUnixMakefileGenerator3::UpdateDependencies(
  const std::string& tgtInfo, bool verbose, bool color)
{
  // read in the target info file
  if (!this->Makefile->ReadListFile(tgtInfo) ||
      cmSystemTools::GetErrorOccurredFlag()) {
    cmSystemTools::Error("Target DependInfo.cmake file not found");
  }

  bool status = true;

  // Check if any multiple output pairs have a missing file.
  this->CheckMultipleOutputs(verbose);

  std::string const targetDir = cmSystemTools::GetFilenamePath(tgtInfo);
  if (!this->Makefile->GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES").empty()) {
    // dependencies are managed by CMake itself

    std::string const internalDependFile = targetDir + "/depend.internal";
    std::string const dependFile = targetDir + "/depend.make";

    // If the target DependInfo.cmake file has changed since the last
    // time dependencies were scanned then force rescanning.  This may
    // happen when a new source file is added and CMake regenerates the
    // project but no other sources were touched.
    bool needRescanDependInfo = false;
    cmFileTimeCache* ftc =
      this->GlobalGenerator->GetCMakeInstance()->GetFileTimeCache();
    {
      int result;
      if (!ftc->Compare(internalDependFile, tgtInfo, &result) || result < 0) {
        if (verbose) {
          cmSystemTools::Stdout(cmStrCat("Dependee \"", tgtInfo,
                                         "\" is newer than depender \"",
                                         internalDependFile, "\".\n"));
        }
        needRescanDependInfo = true;
      }
    }

    // If the directory information is newer than depend.internal, include
    // dirs may have changed. In this case discard all old dependencies.
    bool needRescanDirInfo = false;
    {
      std::string dirInfoFile =
        cmStrCat(this->GetCurrentBinaryDirectory(),
                 "/CMakeFiles/CMakeDirectoryInformation.cmake");
      int result;
      if (!ftc->Compare(internalDependFile, dirInfoFile, &result) ||
          result < 0) {
        if (verbose) {
          cmSystemTools::Stdout(cmStrCat("Dependee \"", dirInfoFile,
                                         "\" is newer than depender \"",
                                         internalDependFile, "\".\n"));
        }
        needRescanDirInfo = true;
      }
    }

    // Check the implicit dependencies to see if they are up to date.
    // The build.make file may have explicit dependencies for the object
    // files but these will not affect the scanning process so they need
    // not be considered.
    cmDepends::DependencyMap validDependencies;
    bool needRescanDependencies = false;
    if (!needRescanDirInfo) {
      cmDependsC checker;
      checker.SetVerbose(verbose);
      checker.SetFileTimeCache(ftc);
      // cmDependsC::Check() fills the vector validDependencies() with the
      // dependencies for those files where they are still valid, i.e.
      // neither the files themselves nor any files they depend on have
      // changed. We don't do that if the CMakeDirectoryInformation.cmake
      // file has changed, because then potentially all dependencies have
      // changed. This information is given later on to cmDependsC, which
      // then only rescans the files where it did not get valid dependencies
      // via this dependency vector. This means that in the normal case, when
      // only few or one file have been edited, then also only this one file
      // is actually scanned again, instead of all files for this target.
      needRescanDependencies =
        !checker.Check(dependFile, internalDependFile, validDependencies);
    }

    if (needRescanDependInfo || needRescanDirInfo || needRescanDependencies) {
      // The dependencies must be regenerated.
      if (verbose) {
        std::string targetName = cmSystemTools::GetFilenameName(targetDir);
        targetName = targetName.substr(0, targetName.length() - 4);
        std::string message =
          cmStrCat("Scanning dependencies of target ", targetName);
        cmSystemTools::MakefileColorEcho(
          cmsysTerminal_Color_ForegroundMagenta |
            cmsysTerminal_Color_ForegroundBold,
          message.c_str(), true, color);
      }

      status = this->ScanDependencies(targetDir, dependFile,
                                      internalDependFile, validDependencies);
    }
  }

  auto depends =
    this->Makefile->GetSafeDefinition("CMAKE_DEPENDS_DEPENDENCY_FILES");
  if (!depends.empty()) {
    // dependencies are managed by compiler
    cmList depFiles{ depends, cmList::EmptyElements::Yes };
    std::string const internalDepFile =
      targetDir + "/compiler_depend.internal";
    std::string const depFile = targetDir + "/compiler_depend.make";
    cmDepends::DependencyMap dependencies;
    cmDependsCompiler depsManager;
    bool projectOnly = cmIsOn(
      this->Makefile->GetSafeDefinition("CMAKE_DEPENDS_IN_PROJECT_ONLY"));

    depsManager.SetVerbose(verbose);
    depsManager.SetLocalGenerator(this);

    if (!depsManager.CheckDependencies(
          internalDepFile, depFiles, dependencies,
          projectOnly ? NotInProjectDir(this->GetSourceDirectory(),
                                        this->GetBinaryDirectory())
                      : std::function<bool(const std::string&)>())) {
      // regenerate dependencies files
      if (verbose) {
        std::string targetName = cmCMakePath(targetDir)
                                   .GetFileName()
                                   .RemoveExtension()
                                   .GenericString();
        auto message =
          cmStrCat("Consolidate compiler generated dependencies of target ",
                   targetName);
        cmSystemTools::MakefileColorEcho(
          cmsysTerminal_Color_ForegroundMagenta |
            cmsysTerminal_Color_ForegroundBold,
          message.c_str(), true, color);
      }

      // Open the make depends file.  This should be copy-if-different
      // because the make tool may try to reload it needlessly otherwise.
      cmGeneratedFileStream ruleFileStream(
        depFile, false, this->GlobalGenerator->GetMakefileEncoding());
      ruleFileStream.SetCopyIfDifferent(true);
      if (!ruleFileStream) {
        return false;
      }

      // Open the cmake dependency tracking file.  This should not be
      // copy-if-different because dependencies are re-scanned when it is
      // older than the DependInfo.cmake.
      cmGeneratedFileStream internalRuleFileStream(
        internalDepFile, false, this->GlobalGenerator->GetMakefileEncoding());
      if (!internalRuleFileStream) {
        return false;
      }

      this->WriteDisclaimer(ruleFileStream);
      this->WriteDisclaimer(internalRuleFileStream);

      depsManager.WriteDependencies(dependencies, ruleFileStream,
                                    internalRuleFileStream);
    }
  }

  // The dependencies are already up-to-date.
  return status;
}